

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void addDataToBuffer(OutputBuffer *buf,size_t size)

{
  OutputBuffer *in_RDI;
  string data;
  string *data_00;
  string local_30 [8];
  size_t in_stack_ffffffffffffffd8;
  
  data_00 = local_30;
  makeString_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo(in_RDI,(data_type *)data_00,0x227504);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void addDataToBuffer(OutputBuffer &buf, size_t size)
{
    std::string data = makeString(size);
    buf.writeTo(data.c_str(), data.size());
}